

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *printer)

{
  size_t sVar1;
  int i;
  undefined8 unaff_RBP;
  long lVar2;
  long lVar3;
  vector<bool,_std::allocator<bool>_> processed;
  allocator_type local_86;
  bool local_85;
  undefined4 local_84;
  _Bvector_base<std::allocator<bool>_> local_80;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  io::Printer::Print(printer,"void $classname$::SharedCtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  local_84 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    sVar1 = HasBitsSize(this);
    if ((sVar1 & 7) != 0) {
      io::Printer::Print(printer,"_cached_size_ = 0;\n");
      local_84 = 0;
    }
  }
  local_85 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_85,&local_86);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_80,
             (vector<bool,_std::allocator<bool>_> *)&local_58);
  GenerateConstructorBody(this,printer,(vector<bool,_std::allocator<bool>_> *)&local_80,false);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(this->descriptor_ + 0x38); lVar2 = lVar2 + 1) {
    io::Printer::Print(printer,"clear_has_$oneof_name$();\n","oneof_name",
                       *(string **)(*(long *)(this->descriptor_ + 0x40) + lVar3));
    lVar3 = lVar3 + 0x30;
  }
  if ((char)local_84 != '\0') {
    io::Printer::Print(printer,"_cached_size_ = 0;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedConstructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedCtor() {\n",
    "classname", classname_);
  printer->Indent();

  bool need_to_clear_cached_size = true;
  // We reproduce the logic used for laying out _cached_sized_ in the class
  // definition, as to initialize it in-order.
  if (HasFieldPresence(descriptor_->file()) &&
      (HasBitsSize() % 8) != 0) {
    printer->Print("_cached_size_ = 0;\n");
    need_to_clear_cached_size = false;
  }

  std::vector<bool> processed(optimized_order_.size(), false);
  GenerateConstructorBody(printer, processed, false);

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "clear_has_$oneof_name$();\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (need_to_clear_cached_size) {
    printer->Print("_cached_size_ = 0;\n");
  }

  printer->Outdent();
  printer->Print("}\n\n");
}